

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::addmultisigaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffeac8;
  allocator<RPCArg> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffead0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffead8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb00;
  allocator<char> *in_stack_ffffffffffffeb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb10;
  undefined7 in_stack_ffffffffffffeb18;
  undefined1 in_stack_ffffffffffffeb1f;
  string *in_stack_ffffffffffffeb20;
  undefined7 in_stack_ffffffffffffeb28;
  undefined1 in_stack_ffffffffffffeb2f;
  undefined4 in_stack_ffffffffffffeb30;
  Type in_stack_ffffffffffffeb34;
  string *in_stack_ffffffffffffeb38;
  undefined4 in_stack_ffffffffffffeb40;
  Type in_stack_ffffffffffffeb44;
  undefined4 in_stack_ffffffffffffeb48;
  Type in_stack_ffffffffffffeb4c;
  RPCArg *in_stack_ffffffffffffeb50;
  RPCArgOptions *in_stack_ffffffffffffeb70;
  undefined1 *local_1470;
  undefined1 *local_1458;
  undefined1 *local_1440;
  undefined1 *local_1428;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  undefined1 local_1230 [37];
  allocator<char> local_120b [3];
  pointer local_1208;
  pointer pRStack_1200;
  pointer local_11f8;
  undefined1 local_11ea;
  RPCResults local_11e9;
  undefined1 local_11ca;
  undefined1 local_11c9 [31];
  allocator<char> local_11aa;
  allocator<char> local_11a9 [17];
  undefined8 local_1198;
  allocator<char> local_118a;
  allocator<char> local_1189;
  size_type local_1188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1180;
  allocator<char> local_116a;
  allocator<char> local_1169 [31];
  allocator<char> local_114a;
  allocator<char> local_1149 [29];
  allocator<char> local_112c;
  allocator<char> local_112b;
  allocator<char> local_112a;
  allocator<char> local_1129;
  undefined4 local_1128;
  allocator<char> local_1123 [2];
  allocator<char> local_1121;
  undefined4 local_1120;
  allocator<char> local_1119 [32];
  allocator<char> local_10f9;
  undefined4 local_10f8;
  allocator<char> local_10f2;
  allocator<char> local_10f1;
  undefined4 local_10f0;
  allocator<char> local_10e9 [31];
  allocator<char> local_10ca;
  allocator<char> local_10c9 [201];
  undefined8 local_1000;
  undefined1 local_e88 [136];
  undefined1 local_e00 [256];
  undefined1 local_d00 [408];
  string local_b68 [4];
  undefined1 local_ae0 [200];
  undefined1 local_a18;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined1 local_9d8;
  undefined1 local_9d7;
  undefined1 local_910;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined1 local_8d0;
  undefined1 local_8cf;
  allocator<RPCArg> local_828 [40];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8;
  undefined1 local_7e7;
  undefined1 local_7e0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0;
  undefined1 local_79f;
  undefined1 local_6f8 [264];
  undefined1 local_5f0 [160];
  undefined1 local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_468 [1056];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_10f0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffead8,(Optional *)in_stack_ffffffffffffead0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_550 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeae0);
  local_528 = 0;
  uStack_520 = 0;
  local_518 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeac8);
  local_510 = 0;
  local_50f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                 in_stack_ffffffffffffeb20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_10f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffead8,(Optional *)in_stack_ffffffffffffead0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_1120 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffead8,(Optional *)in_stack_ffffffffffffead0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_7e0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeae0);
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_7a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeac8);
  local_7a0 = 0;
  local_79f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                 in_stack_ffffffffffffeb20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffeac8);
  __l._M_len._0_7_ = in_stack_ffffffffffffeb18;
  __l._M_array = (iterator)in_stack_ffffffffffffeb10;
  __l._M_len._7_1_ = in_stack_ffffffffffffeb1f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb08,__l,
             (allocator_type *)in_stack_ffffffffffffeb00);
  local_828[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffeae0);
  local_800 = 0;
  uStack_7f8 = 0;
  local_7f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeac8);
  local_7e8 = 0;
  local_7e7 = 0;
  this = local_828;
  RPCArg::RPCArg(in_stack_ffffffffffffeb50,
                 (string *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
                 in_stack_ffffffffffffeb44,(Fallback *)in_stack_ffffffffffffeb38,
                 (string *)CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                 in_stack_ffffffffffffeb70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_1128 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffead8,(Optional *)in_stack_ffffffffffffead0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_910 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeae0);
  local_8e8 = 0;
  uStack_8e0 = 0;
  local_8d8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_8d0 = 0;
  local_8cf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                 in_stack_ffffffffffffeb20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_a18 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeae0);
  local_9f0 = 0;
  uStack_9e8 = 0;
  local_9e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_9d8 = 0;
  local_9d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                 in_stack_ffffffffffffeb20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18));
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffeb18;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeb10;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffeb1f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb08,__l_00,
             (allocator_type *)in_stack_ffffffffffffeb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_1188 = 0;
  aStack_1180._M_allocated_capacity = 0;
  aStack_1180._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c,
             (string *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             in_stack_ffffffffffffeb38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
             (bool)in_stack_ffffffffffffeb2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_11a9[1] = (allocator<char>)0x0;
  local_11a9[2] = (allocator<char>)0x0;
  local_11a9[3] = (allocator<char>)0x0;
  local_11a9[4] = (allocator<char>)0x0;
  local_11a9[5] = (allocator<char>)0x0;
  local_11a9[6] = (allocator<char>)0x0;
  local_11a9[7] = (allocator<char>)0x0;
  local_11a9[8] = (allocator<char>)0x0;
  local_11a9[9] = (allocator<char>)0x0;
  local_11a9[10] = (allocator<char>)0x0;
  local_11a9[0xb] = (allocator<char>)0x0;
  local_11a9[0xc] = (allocator<char>)0x0;
  local_11a9[0xd] = (allocator<char>)0x0;
  local_11a9[0xe] = (allocator<char>)0x0;
  local_11a9[0xf] = (allocator<char>)0x0;
  local_11a9[0x10] = (allocator<char>)0x0;
  local_1198._0_1_ = '\0';
  local_1198._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c,
             (string *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             in_stack_ffffffffffffeb38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
             (bool)in_stack_ffffffffffffeb2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_11c9._1_8_ = 0;
  local_11c9._9_8_ = 0;
  local_11c9._17_8_ = 0;
  this_02 = (RPCHelpMan *)(local_11c9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c,
             (string *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             in_stack_ffffffffffffeb38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
             (bool)in_stack_ffffffffffffeb2f);
  description = local_b68;
  name = (string *)local_11c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_11ca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  results = &local_11e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  examples = (RPCExamples *)&local_11ea;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  local_1208 = (pointer)0x0;
  pRStack_1200 = (pointer)0x0;
  local_11f8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c,
             (string *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             in_stack_ffffffffffffeb38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
             (bool)in_stack_ffffffffffffeb2f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffeb18;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeb10;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffeb1f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb08,__l_01,
             (allocator_type *)in_stack_ffffffffffffeb00);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
             in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb38,
             SUB41(in_stack_ffffffffffffeb34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb20,
             (bool)in_stack_ffffffffffffeb1f);
  std::allocator<RPCResult>::allocator(this_00);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffeb18;
  __l_02._M_array = (iterator)in_stack_ffffffffffffeb10;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffeb1f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb08,__l_02,
             (allocator_type *)in_stack_ffffffffffffeb00);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c,
             (string *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             in_stack_ffffffffffffeb38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30),
             (bool)in_stack_ffffffffffffeb2f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                 in_stack_ffffffffffffeb10);
  std::operator+(in_stack_ffffffffffffeae0,(char *)in_stack_ffffffffffffead8);
  std::operator+(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  std::operator+(in_stack_ffffffffffffeae0,(char *)in_stack_ffffffffffffead8);
  HelpExampleCli(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  std::operator+((char *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  std::operator+(in_stack_ffffffffffffeae0,(char *)in_stack_ffffffffffffead8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                 in_stack_ffffffffffffeb10);
  std::operator+(in_stack_ffffffffffffeae0,(char *)in_stack_ffffffffffffead8);
  std::operator+(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  std::operator+(in_stack_ffffffffffffeae0,(char *)in_stack_ffffffffffffead8);
  HelpExampleRpc(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  std::operator+(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x4c0626);
  this_01 = (RPCArg *)local_1230;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::addmultisigaddress()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffead8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffead0);
  RPCHelpMan::RPCHelpMan(this_02,name,description,args,results,examples,(RPCMethodImpl *)in_RDI);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1230 + 0x24));
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_120b);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1428 = local_ae0;
  do {
    local_1428 = local_1428 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1428 != local_d00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1440 = local_e00;
  do {
    local_1440 = local_1440 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1440 != local_e88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_11ea);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_11ca);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_11c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11aa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_11a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_118a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1189);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffead8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_116a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1169);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_114a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1149);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffead8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_1458 = local_48;
  do {
    local_1458 = local_1458 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_1458 != local_468);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_112c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_112b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_112a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1129);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1123);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffead8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_1470 = local_5f0;
  do {
    local_1470 = local_1470 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_1470 != local_6f8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1123 + 2);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1119);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_10f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_10f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_10f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_10e9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_10ca);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_10c9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan addmultisigaddress()
{
    return RPCHelpMan{"addmultisigaddress",
                "\nAdd an nrequired-to-sign multisignature address to the wallet. Requires a new wallet backup.\n"
                "Each key is a Bitcoin address or hex-encoded public key.\n"
                "This functionality is only intended for use with non-watchonly addresses.\n"
                "See `importaddress` for watchonly p2sh address support.\n"
                "If 'label' is specified, assign address to that label.\n"
                "Note: This command is only compatible with legacy wallets.\n",
                {
                    {"nrequired", RPCArg::Type::NUM, RPCArg::Optional::NO, "The number of required signatures out of the n keys or addresses."},
                    {"keys", RPCArg::Type::ARR, RPCArg::Optional::NO, "The bitcoin addresses or hex-encoded public keys",
                        {
                            {"key", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "bitcoin address or hex-encoded public key"},
                        },
                        },
                    {"label", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A label to assign the addresses to."},
                    {"address_type", RPCArg::Type::STR, RPCArg::DefaultHint{"set by -addresstype"}, "The address type to use. Options are \"legacy\", \"p2sh-segwit\", and \"bech32\"."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The value of the new multisig address"},
                        {RPCResult::Type::STR_HEX, "redeemScript", "The string value of the hex-encoded redemption script"},
                        {RPCResult::Type::STR, "descriptor", "The descriptor for this multisig"},
                        {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Any warnings resulting from the creation of this multisig",
                        {
                            {RPCResult::Type::STR, "", ""},
                        }},
                    }
                },
                RPCExamples{
            "\nAdd a multisig address from 2 addresses\n"
            + HelpExampleCli("addmultisigaddress", "2 \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("addmultisigaddress", "2, \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LegacyScriptPubKeyMan& spk_man = EnsureLegacyScriptPubKeyMan(*pwallet);

    LOCK2(pwallet->cs_wallet, spk_man.cs_KeyStore);

    const std::string label{LabelFromValue(request.params[2])};

    int required = request.params[0].getInt<int>();

    // Get the public keys
    const UniValue& keys_or_addrs = request.params[1].get_array();
    std::vector<CPubKey> pubkeys;
    for (unsigned int i = 0; i < keys_or_addrs.size(); ++i) {
        if (IsHex(keys_or_addrs[i].get_str()) && (keys_or_addrs[i].get_str().length() == 66 || keys_or_addrs[i].get_str().length() == 130)) {
            pubkeys.push_back(HexToPubKey(keys_or_addrs[i].get_str()));
        } else {
            pubkeys.push_back(AddrToPubKey(spk_man, keys_or_addrs[i].get_str()));
        }
    }

    OutputType output_type = pwallet->m_default_address_type;
    if (!request.params[3].isNull()) {
        std::optional<OutputType> parsed = ParseOutputType(request.params[3].get_str());
        if (!parsed) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown address type '%s'", request.params[3].get_str()));
        } else if (parsed.value() == OutputType::BECH32M) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Bech32m multisig addresses cannot be created with legacy wallets");
        }
        output_type = parsed.value();
    }

    // Construct multisig scripts
    FlatSigningProvider provider;
    CScript inner;
    CTxDestination dest = AddAndGetMultisigDestination(required, pubkeys, output_type, provider, inner);

    // Import scripts into the wallet
    for (const auto& [id, script] : provider.scripts) {
        // Due to a bug in the legacy wallet, the p2sh maximum script size limit is also imposed on 'p2sh-segwit' and 'bech32' redeem scripts.
        // Even when redeem scripts over MAX_SCRIPT_ELEMENT_SIZE bytes are valid for segwit output types, we don't want to
        // enable it because:
        // 1) It introduces a compatibility-breaking change requiring downgrade protection; older wallets would be unable to interact with these "new" legacy wallets.
        // 2) Considering the ongoing deprecation of the legacy spkm, this issue adds another good reason to transition towards descriptors.
        if (script.size() > MAX_SCRIPT_ELEMENT_SIZE) throw JSONRPCError(RPC_WALLET_ERROR, "Unsupported multisig script size for legacy wallet. Upgrade to descriptors to overcome this limitation for p2sh-segwit or bech32 scripts");

        if (!spk_man.AddCScript(script)) {
            if (CScript inner_script; spk_man.GetCScript(CScriptID(script), inner_script)) {
                CHECK_NONFATAL(inner_script == script); // Nothing to add, script already contained by the wallet
                continue;
            }
            throw JSONRPCError(RPC_WALLET_ERROR, strprintf("Error importing script into the wallet"));
        }
    }

    // Store destination in the addressbook
    pwallet->SetAddressBook(dest, label, AddressPurpose::SEND);

    // Make the descriptor
    std::unique_ptr<Descriptor> descriptor = InferDescriptor(GetScriptForDestination(dest), spk_man);

    UniValue result(UniValue::VOBJ);
    result.pushKV("address", EncodeDestination(dest));
    result.pushKV("redeemScript", HexStr(inner));
    result.pushKV("descriptor", descriptor->ToString());

    UniValue warnings(UniValue::VARR);
    if (descriptor->GetOutputType() != output_type) {
        // Only warns if the user has explicitly chosen an address type we cannot generate
        warnings.push_back("Unable to make chosen address type, please ensure no uncompressed public keys are present.");
    }
    PushWarnings(warnings, result);

    return result;
},
    };
}